

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.hpp
# Opt level: O0

String * __thiscall
Diligent::GetShaderResourcePrintName_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,char *Name,Uint32 ArraySize,
          Uint32 ArrayIndex)

{
  Char *Message;
  string local_70;
  allocator local_4e;
  undefined1 local_4d;
  undefined1 local_40 [8];
  string msg;
  Uint32 ArrayIndex_local;
  Uint32 ArraySize_local;
  char *Name_local;
  String *PrintName;
  
  msg.field_2._12_4_ = SUB84(Name,0);
  msg.field_2._8_4_ = ArraySize;
  if ((uint)msg.field_2._12_4_ <= ArraySize) {
    FormatString<char[28]>((string *)local_40,(char (*) [28])"Array index is out of range");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderResourcePrintName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/GraphicsAccessories.hpp"
               ,0x323);
    std::__cxx11::string::~string((string *)local_40);
  }
  local_4d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,&local_4e);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  if (1 < (uint)msg.field_2._12_4_) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::to_string(&local_70,msg.field_2._8_4_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String GetShaderResourcePrintName(const char* Name, Uint32 ArraySize, Uint32 ArrayIndex)
{
    VERIFY(ArrayIndex < ArraySize, "Array index is out of range");
    String PrintName = Name;
    if (ArraySize > 1)
    {
        PrintName.push_back('[');
        PrintName.append(std::to_string(ArrayIndex));
        PrintName.push_back(']');
    }
    return PrintName;
}